

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::checkExplanation(SAT *this,Clause *c,int clevel,int index)

{
  FILE *__stream;
  char *pcVar1;
  char *local_50;
  
  __stream = _stderr;
  pcVar1 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/conflict.cpp"
                   ,0x2f);
  if (pcVar1 == (char *)0x0) {
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/conflict.cpp";
  }
  else {
    local_50 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/conflict.cpp"
                       ,0x2f);
    local_50 = local_50 + 1;
  }
  fprintf(__stream,"%s:%d: ",local_50,0x287);
  fprintf(_stderr,"Not yet supported\n");
  abort();
}

Assistant:

void SAT::checkExplanation(Clause& c, int clevel, int index) {
	NOT_SUPPORTED;
	for (unsigned int i = 1; i < c.size(); i++) {
		assert(value(c[i]) == l_False);
		assert(trailpos[var(c[i])] < engine.trail_lim[clevel]);
		vec<Lit>& ctrail = trail[trailpos[var(c[i])]];
		int pos = -1;
		for (unsigned int j = 0; j < ctrail.size(); j++) {
			if (var(ctrail[j]) == var(c[i])) {
				pos = j;
				if (trailpos[var(c[i])] == clevel) {
					assert(static_cast<int>(j) <= index);
				}
				break;
			}
		}
		assert(pos != -1);
	}
}